

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O2

int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)

{
  int iVar1;
  size_t sStack_8;
  
  switch(ud->type) {
  case '\x02':
    iVar1 = flatcc_verify_union_table(ud,Fantasy_Attacker_verify_table);
    return iVar1;
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
    return 0;
  case '\b':
    sStack_8 = 8;
    break;
  case '\t':
  case '\n':
    sStack_8 = 4;
    break;
  case '\v':
    iVar1 = flatcc_verify_union_string(ud);
    return iVar1;
  default:
    if (ud->type != 0xff) {
      return 0;
    }
    iVar1 = verify_string(ud->buf,ud->end,ud->base,ud->offset);
    return iVar1;
  }
  iVar1 = flatcc_verify_union_struct(ud,sStack_8,4);
  return iVar1;
}

Assistant:

static int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)
{
    switch (ud->type) {
    case 2: return flatcc_verify_union_table(ud, Fantasy_Attacker_verify_table); /* MuLan */
    case 8: return flatcc_verify_union_struct(ud, 8, 4); /* Rapunzel */
    case 9: return flatcc_verify_union_struct(ud, 4, 4); /* Belle */
    case 10: return flatcc_verify_union_struct(ud, 4, 4); /* BookFan */
    case 11: return flatcc_verify_union_string(ud); /* Other */
    case 255: return flatcc_verify_union_string(ud); /* Unused */
    default: return flatcc_verify_ok;
    }
}